

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCoordsys.h
# Opt level: O0

ChVector<double> * __thiscall
chrono::ChCoordsys<double>::TransformPointLocalToParent
          (ChVector<double> *__return_storage_ptr__,ChCoordsys<double> *this,ChVector<double> *local
          )

{
  ChVector<double> local_38;
  ChVector<double> *local_20;
  ChVector<double> *local_local;
  ChCoordsys<double> *this_local;
  
  local_20 = local;
  local_local = &this->pos;
  this_local = (ChCoordsys<double> *)__return_storage_ptr__;
  ChQuaternion<double>::Rotate(&local_38,&this->rot,local);
  ChVector<double>::operator+(__return_storage_ptr__,&this->pos,&local_38);
  return __return_storage_ptr__;
}

Assistant:

ChVector<Real> TransformPointLocalToParent(const ChVector<Real>& local) const { return pos + rot.Rotate(local); }